

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

value_type __thiscall djb::utia::eval(utia *this,vec3 *wi,vec3 *wo,void *param_3)

{
  const_reference pvVar1;
  float_t *__p;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar2;
  float_t fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  value_type vVar9;
  vec3 vVar10;
  vec3 local_f0;
  float local_dc;
  float local_d8;
  float local_d4;
  vec3 local_d0;
  undefined1 local_c4 [8];
  vec3 rgb;
  int idx;
  float_t w;
  int l;
  int k;
  int j;
  int i;
  int isp;
  float_t RGB [3];
  int nr;
  int nc;
  float_t wpv [2];
  float_t wpi [2];
  float_t wtv [2];
  float_t wti [2];
  float_t sum;
  int ipv [2];
  int ipi [2];
  int itv [2];
  int iti [2];
  float_t phi_o;
  float_t phi_i;
  float_t theta_o;
  float_t theta_i;
  float_t r2d;
  void *param_3_local;
  vec3 *wo_local;
  vec3 *wi_local;
  utia *this_local;
  
  fVar3 = m_pi();
  fVar4 = 180.0 / fVar3;
  dVar8 = std::acos((double)(ulong)(uint)wo->z);
  fVar5 = fVar4 * SUB84(dVar8,0);
  dVar8 = std::acos((double)(ulong)*(uint *)((long)param_3 + 8));
  fVar6 = fVar4 * SUB84(dVar8,0);
  dVar8 = std::atan2((double)(ulong)(uint)wo->y,(double)(ulong)(uint)wo->x);
  iti[1] = (int)(fVar4 * SUB84(dVar8,0));
  dVar8 = std::atan2((double)(ulong)*(uint *)((long)param_3 + 4),(double)(ulong)*param_3);
  iti[0] = (int)(fVar4 * SUB84(dVar8,0));
  if ((90.0 <= fVar5) || (90.0 <= fVar6)) {
    (**(code **)(*(long *)wi + 0x10))(this);
    pfVar2 = extraout_RDX;
  }
  else {
    for (; (float)iti[1] < 0.0; iti[1] = (int)((float)iti[1] + 360.0)) {
    }
    for (; (float)iti[0] < 0.0; iti[0] = (int)((float)iti[0] + 360.0)) {
    }
    for (; 360.0 <= (float)iti[1]; iti[1] = (int)((float)iti[1] - 360.0)) {
    }
    for (; 360.0 <= (float)iti[0]; iti[0] = (int)((float)iti[0] - 360.0)) {
    }
    dVar8 = std::floor((double)(ulong)(uint)(fVar5 / 15.0));
    itv[0] = (int)SUB84(dVar8,0);
    itv[1] = itv[0] + 1;
    if (4 < itv[0]) {
      itv[0] = 4;
      itv[1] = 5;
    }
    dVar8 = std::floor((double)(ulong)(uint)(fVar6 / 15.0));
    ipi[0] = (int)SUB84(dVar8,0);
    ipi[1] = ipi[0] + 1;
    if (4 < ipi[0]) {
      ipi[0] = 4;
      ipi[1] = 5;
    }
    dVar8 = std::floor((double)(ulong)(uint)((float)iti[1] / 7.5));
    ipv[0] = (int)SUB84(dVar8,0);
    ipv[1] = ipv[0] + 1;
    dVar8 = std::floor((double)(ulong)(uint)((float)iti[0] / 7.5));
    wti[1] = (float_t)(int)SUB84(dVar8,0);
    fVar4 = (float)itv[0] * -15.0 + fVar5;
    fVar5 = (float)itv[1] * 15.0 + -fVar5;
    fVar7 = fVar5 + fVar4;
    wtv[0] = fVar5 / fVar7;
    wtv[1] = fVar4 / fVar7;
    fVar4 = (float)ipi[0] * -15.0 + fVar6;
    fVar5 = (float)ipi[1] * 15.0 + -fVar6;
    fVar6 = fVar5 + fVar4;
    wpi[0] = fVar5 / fVar6;
    wpi[1] = fVar4 / fVar6;
    fVar4 = (float)ipv[0] * -7.5 + (float)iti[1];
    fVar5 = (float)ipv[1] * 7.5 + -(float)iti[1];
    fVar6 = fVar5 + fVar4;
    wpv[0] = fVar5 / fVar6;
    wpv[1] = fVar4 / fVar6;
    fVar4 = (float)(int)wti[1] * -7.5 + (float)iti[0];
    fVar5 = (float)((int)wti[1] + 1) * 7.5 + -(float)iti[0];
    wti[0] = fVar5 + fVar4;
    nr = (int)(fVar5 / wti[0]);
    nc = (int)(fVar4 / wti[0]);
    if (ipv[1] == 0x30) {
      ipv[1] = 0;
    }
    RGB[2] = 4.03574e-43;
    RGB[1] = 4.03574e-43;
    for (j = 0; j < 3; j = j + 1) {
      (&i)[j] = 0;
      for (k = 0; k < 2; k = k + 1) {
        for (l = 0; l < 2; l = l + 1) {
          for (w = 0.0; (int)w < 2; w = (float_t)((int)w + 1)) {
            for (idx = 0; idx < 2; idx = idx + 1) {
              fVar4 = wtv[k] * wpi[l] * wpv[(int)w] * (float)(&nr)[idx];
              rgb.y = (float_t)(j * (int)RGB[1] * (int)RGB[2] +
                                (int)RGB[2] * (itv[k] * 0x30 + ipv[(int)w]) + ipi[l] * 0x30 +
                               (int)wti[(long)idx + 1]);
              rgb.z = fVar4;
              pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)&wi->z,(long)(int)rgb.y
                                 );
              (&i)[j] = (int)(fVar4 * (float)*pvVar1 + (float)(&i)[j]);
            }
          }
        }
      }
      if ((float)(&i)[j] <= 0.0375) {
        (&i)[j] = (int)((float)(&i)[j] / 12.92);
      }
      else {
        dVar8 = std::pow((double)(ulong)(uint)(((float)(&i)[j] + 0.055) / 1.055),
                         5.3132785254479e-315);
        (&i)[j] = SUB84(dVar8,0);
      }
      (&i)[j] = (int)((float)(&i)[j] * 100.0);
    }
    fVar3 = *(float_t *)((long)param_3 + 8);
    local_d4 = 0.0;
    fVar4 = max<float>(&local_d4,(float *)&i);
    local_d8 = 0.0;
    fVar5 = max<float>(&local_d8,(float *)&isp);
    local_dc = 0.0;
    fVar6 = max<float>(&local_dc,RGB);
    vec3::vec3(&local_d0,fVar4,fVar5,fVar6);
    vVar10 = djb::operator*(fVar3,&local_d0);
    local_f0._0_8_ = vVar10._0_8_;
    local_c4._0_4_ = local_f0.x;
    local_c4._4_4_ = local_f0.y;
    local_f0.z = vVar10.z;
    rgb.x = local_f0.z;
    __p = vec3::operator[]((vec3 *)local_c4,0);
    std::valarray<float>::valarray((valarray<float> *)this,__p,3);
    pfVar2 = extraout_RDX_00;
  }
  vVar9._M_data = pfVar2;
  vVar9._M_size = (size_t)this;
  return vVar9;
}

Assistant:

brdf::value_type
utia::eval(const vec3 &wi, const vec3 &wo, const void *) const
{
	float_t r2d = 180 / m_pi();
	float_t theta_i = r2d * acos(wi.z);
	float_t theta_o = r2d * acos(wo.z);
	float_t phi_i = r2d * atan2(wi.y, wi.x);
	float_t phi_o = r2d * atan2(wo.y, wo.x);

	// make sure we're above horizon
	if (theta_i >= 90 || theta_o >= 90)
		return zero_value();

	// make sure phi is in [0, 360)
	while (phi_i < 0) {phi_i+= 360;}
	while (phi_o < 0) {phi_o+= 360;}
	while (phi_i >= 360) {phi_i-= 360;}
	while (phi_o >= 360) {phi_o-= 360;}

	int iti[2], itv[2], ipi[2], ipv[2];
	iti[0] = (int)floor(theta_i / DJB__UTIA_STEP_T);
	iti[1] = iti[0] + 1;
	if(iti[0] > DJB__UTIA_NTI - 2) {
		iti[0] = DJB__UTIA_NTI - 2;
		iti[1] = DJB__UTIA_NTI - 1;
	}
	itv[0] = (int)floor(theta_o / DJB__UTIA_STEP_T);
	itv[1] = itv[0] + 1;
	if(itv[0] > DJB__UTIA_NTV - 2) {
		itv[0] = DJB__UTIA_NTV - 2;
		itv[1] = DJB__UTIA_NTV - 1;
	}

	ipi[0] = (int)floor(phi_i / DJB__UTIA_STEP_P);
	ipi[1] = ipi[0] + 1;
	ipv[0] = (int)floor(phi_o / DJB__UTIA_STEP_P);
	ipv[1] = ipv[0] + 1;

	float_t sum;
	float_t wti[2], wtv[2], wpi[2], wpv[2];
	wti[1] = theta_i - (float_t)(DJB__UTIA_STEP_T * iti[0]);
	wti[0] = (float_t)(DJB__UTIA_STEP_T * iti[1]) - theta_i;
	sum = wti[0] + wti[1];
	wti[0]/= sum;
	wti[1]/= sum;
	wtv[1] = theta_o - (float_t)(DJB__UTIA_STEP_T * itv[0]);
	wtv[0] = (float_t)(DJB__UTIA_STEP_T * itv[1]) - theta_o;
	sum = wtv[0] + wtv[1];
	wtv[0]/= sum;
	wtv[1]/= sum;

	wpi[1] = phi_i - (float_t)(DJB__UTIA_STEP_P * ipi[0]);
	wpi[0] = (float_t)(DJB__UTIA_STEP_P * ipi[1]) - phi_i;
	sum = wpi[0] + wpi[1];
	wpi[0]/= sum;
	wpi[1]/= sum;
	wpv[1] = phi_o - (float_t)(DJB__UTIA_STEP_P * ipv[0]);
	wpv[0] = (float_t)(DJB__UTIA_STEP_P * ipv[1]) - phi_o;
	sum = wpv[0] + wpv[1];
	wpv[0]/= sum;
	wpv[1]/= sum;

	if(ipi[1] == DJB__UTIA_NPI)
		ipi[1] = 0;
	if(ipv[1] == DJB__UTIA_NPV)
		ipv[1] = 0;

	int nc = DJB__UTIA_NPV * DJB__UTIA_NTV;
	int nr = DJB__UTIA_NPI * DJB__UTIA_NTI;
	float_t RGB[DJB__UTIA_PLANES];
	for(int isp = 0; isp < DJB__UTIA_PLANES; ++isp) {
		int i, j, k, l;

		RGB[isp] = 0;
		for(i = 0; i < 2; ++i)
		for(j = 0; j < 2; ++j)
		for(k = 0; k < 2; ++k)
		for(l = 0; l < 2; ++l) {
			float_t w = wti[i] * wtv[j] * wpi[k] * wpv[l];
			int idx = isp * nr * nc + nc * (DJB__UTIA_NPI * iti[i] + ipi[k]) 
			        + DJB__UTIA_NPV * itv[j] + ipv[l];

			RGB[isp]+= w * (float_t)m_samples[idx];
		}
		if (RGB[isp] > (float_t)0.0375)
			RGB[isp] = pow((RGB[isp] + (float_t)0.055)/(float_t)1.055, (float_t)2.4);
		else
			RGB[isp]/= (float_t)12.92;
		RGB[isp]*= 100;
	}

	vec3 rgb = wo.z * vec3(
		max((float_t)0, RGB[0]),
		max((float_t)0, RGB[1]),
		max((float_t)0, RGB[2])
	);

	return brdf::value_type(&rgb[0], 3);
}